

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void blend_color_generic_fp(int count,QT_FT_Span *spans,void *userData)

{
  long lVar1;
  char cVar2;
  QThreadPool *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  anon_class_48_6_31ab0bab local_128;
  float a;
  float b;
  float g;
  float r;
  Operator op;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&op,&DAT_0061d730,0xb0);
  getOperator(&op,(QSpanData *)userData,(QT_FT_Span *)0x0,0);
  if ((op.funcSolidFP == (CompositionFunctionSolidFP)0x0) ||
     (op.destFetchFP == (DestFetchProcFP)0x0)) {
    lcQtGuiDrawHelper();
    if (((byte)lcQtGuiDrawHelper::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      local_128.op._0_4_ = 2;
      local_128.op._4_4_ = 0;
      local_128.spans._0_4_ = 0;
      local_128.spans._4_4_ = 0;
      local_128.solidFill = false;
      local_128._17_3_ = 0;
      local_128.bpp = BPPNone;
      local_128.data = (QSpanData *)lcQtGuiDrawHelper::category.name;
      QMessageLogger::debug
                ((char *)&local_128,
                 "blend_color_generic_fp: unsupported 4xF16 blend attempted, falling back to 32-bit"
                );
    }
    blend_color_generic(count,spans,userData);
  }
  else {
    r = -NAN;
    g = -NAN;
    b = -NAN;
    a = -NAN;
    QColor::getRgbF((QColor *)((long)userData + 0x98),&r,&g,&b,&a);
    local_128.bpp = qPixelLayouts[*(uint *)(*userData + 0x10)].bpp;
    local_128._17_3_ = 0xaaaaaa;
    local_128.solidFill = op.mode == CompositionMode_Source;
    local_128.color.r = r;
    local_128.color.g = g;
    local_128.color.b = b;
    local_128.color.a = a;
    uVar7 = (long)(count + 0x20) / 0x40 & 0xffffffff;
    local_128.data = (QSpanData *)userData;
    local_128.op = &op;
    local_128.spans = spans;
    pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
    if (((0x5f < count) && (pQVar3 != (QThreadPool *)0x0)) &&
       (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp)) {
      QThread::currentThread();
      cVar2 = QThreadPool::contains((QThread *)pQVar3);
      if (cVar2 == '\0') {
        _semaphore = &DAT_aaaaaaaaaaaaaaaa;
        iVar8 = 0;
        QSemaphore::QSemaphore(&semaphore,0);
        while( true ) {
          iVar6 = (int)uVar7;
          uVar7 = (ulong)(iVar6 - 1);
          if (iVar6 == 0) break;
          iVar6 = (count - iVar8) / iVar6;
          puVar4 = (undefined8 *)operator_new(0x18);
          *(undefined1 *)(puVar4 + 1) = 1;
          *puVar4 = QFactoryLoader::keyMap;
          puVar5 = (undefined8 *)operator_new(0x20);
          *puVar5 = QRunnable::QGenericRunnable::
                    Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4145:5)>
                    ::impl;
          *(int *)(puVar5 + 1) = iVar8;
          *(int *)((long)puVar5 + 0xc) = iVar6;
          puVar5[2] = &local_128;
          puVar5[3] = &semaphore;
          puVar4[2] = puVar5;
          QThreadPool::start((QRunnable *)pQVar3,(int)puVar4);
          iVar8 = iVar8 + iVar6;
        }
        QSemaphore::acquire((int)&semaphore);
        QSemaphore::~QSemaphore(&semaphore);
        goto LAB_005a9bf0;
      }
    }
    blend_color_generic_fp::anon_class_48_6_31ab0bab::operator()(&local_128,0,count);
  }
LAB_005a9bf0:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_color_generic_fp(int count, const QT_FT_Span *spans, void *userData)
{
#if QT_CONFIG(raster_fp)
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    const Operator op = getOperator(data, nullptr, 0);
    if (!op.funcSolidFP || !op.destFetchFP) {
        qCDebug(lcQtGuiDrawHelper, "blend_color_generic_fp: unsupported 4xF16 blend attempted, falling back to 32-bit");
        return blend_color_generic(count, spans, userData);
    }

    float r, g, b, a;
    data->solidColor.getRgbF(&r, &g, &b, &a);
    const QRgbaFloat32 color{r, g, b, a};
    const bool solidFill = op.mode == QPainter::CompositionMode_Source;
    QPixelLayout::BPP bpp = qPixelLayouts[data->rasterBuffer->format].bpp;

    auto function = [=, &op] (int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED QRgbaFloat32 buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            if (solidFill && bpp >= QPixelLayout::BPP8 && spans[c].coverage == 255 && length && op.destStoreFP) {
                // If dest doesn't matter we don't need to bother with blending or converting all the identical pixels
                op.destStoreFP(data->rasterBuffer, x, spans[c].y, &color, 1);
                spanfill_from_first(data->rasterBuffer, bpp, x, spans[c].y, length);
                length = 0;
            }

            while (length) {
                int l = qMin(BufferSize, length);
                QRgbaFloat32 *dest = op.destFetchFP(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.funcSolidFP(dest, l, color, spans[c].coverage);
                if (op.destStoreFP)
                    op.destStoreFP(data->rasterBuffer, x, spans[c].y, dest, l);
                length -= l;
                x += l;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
#else
    blend_color_generic(count, spans, userData);
#endif
}